

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateProcessCommunications(HelicsFederate fed,HelicsTime period,HelicsError *err)

{
  Federate *this;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffb8;
  milliseconds in_stack_ffffffffffffffc0;
  TimeRepresentation<count_time<9,_long>_> local_30;
  rep local_28;
  Federate *local_20;
  
  this = getFed((HelicsFederate)in_stack_ffffffffffffffc0.__r,in_stack_ffffffffffffffb8);
  if (this != (Federate *)0x0) {
    local_20 = this;
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation(&local_30,(double)this);
    local_28 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                              ((TimeRepresentation<count_time<9,_long>_> *)this);
    helics::Federate::processCommunication((Federate *)local_28,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void helicsFederateProcessCommunications(HelicsFederate fed, HelicsTime period, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->processCommunication(helics::Time(period).to_ms());
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}